

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall cmCTest::ReadCustomConfigurationFileTree(cmCTest *this,char *dir,cmMakefile *mf)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  _Base_ptr p_Var6;
  pointer pbVar7;
  Glob gl;
  string fname;
  string rexpr;
  VectorOfStrings ndirs;
  VectorOfStrings dirs;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  dirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ndirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ndirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ndirs.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                           "* Read custom CTest configuration directory: ");
  poVar4 = std::operator<<(poVar4,dir);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa5b,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string((string *)&fname,dir,(allocator *)&cmCTestLog_msg);
  std::__cxx11::string::append((char *)&fname);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"* Check for file: ");
  poVar4 = std::operator<<(poVar4,(string *)&fname);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa60,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar1 = cmsys::SystemTools::FileExists(fname._M_dataplus._M_p);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"* Read custom CTest configuration file: ");
    poVar4 = std::operator<<(poVar4,(string *)&fname);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0xa64,(char *)gl.Internals,false);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    cmSystemTools::s_FatalErrorOccured = false;
    cmSystemTools::s_ErrorOccured = false;
    bVar3 = cmMakefile::ReadListFile(mf,fname._M_dataplus._M_p);
    if (bVar3) {
      bVar3 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar3) goto LAB_002aaad4;
    }
    else {
LAB_002aaad4:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem reading custom configuration: ");
      poVar4 = std::operator<<(poVar4,(string *)&fname);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa6d,(char *)gl.Internals,false);
      std::__cxx11::string::~string((string *)&gl);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    if (bVar2) {
      cmSystemTools::s_ErrorOccured = true;
    }
  }
  std::__cxx11::string::string((string *)&rexpr,dir,(allocator *)&cmCTestLog_msg);
  std::__cxx11::string::append((char *)&rexpr);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"* Check for file: ");
  poVar4 = std::operator<<(poVar4,(string *)&rexpr);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0xa79,(char *)gl.Internals,false);
  std::__cxx11::string::~string((string *)&gl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (!bVar1) {
    bVar1 = cmsys::SystemTools::FileExists(rexpr._M_dataplus._M_p);
    if (!bVar1) goto LAB_002aae66;
    cmsys::Glob::Glob(&gl);
    gl.Recurse = true;
    cmsys::Glob::FindFiles(&gl,&rexpr,(GlobMessages *)0x0);
    pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
    for (pbVar7 = (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != (pvVar5->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"* Read custom CTest configuration file: "
                              );
      poVar4 = std::operator<<(poVar4,(string *)pbVar7);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::stringbuf::str();
      Log(this,0,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
          ,0xa85,local_1c8[0],false);
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar1 = cmMakefile::ReadListFile(mf,(pbVar7->_M_dataplus)._M_p);
      if (bVar1) {
        bVar1 = cmSystemTools::GetErrorOccuredFlag();
        if (bVar1) goto LAB_002aad07;
      }
      else {
LAB_002aad07:
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Problem reading custom configuration: "
                                );
        poVar4 = std::operator<<(poVar4,(string *)pbVar7);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::stringbuf::str();
        Log(this,6,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0xa8b,local_1c8[0],false);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      }
    }
    cmsys::Glob::~Glob(&gl);
  }
  for (p_Var6 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "* Read custom CTest configuration vectors for handler: ");
    poVar4 = std::operator<<(poVar4,(string *)(p_Var6 + 1));
    poVar4 = std::operator<<(poVar4," (");
    poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0xa99,(char *)gl.Internals,false);
    std::__cxx11::string::~string((string *)&gl);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    (**(code **)(**(long **)(p_Var6 + 2) + 0x20))(*(long **)(p_Var6 + 2),mf);
  }
LAB_002aae66:
  std::__cxx11::string::~string((string *)&rexpr);
  std::__cxx11::string::~string((string *)&fname);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&ndirs);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&dirs);
  return 1;
}

Assistant:

int cmCTest::ReadCustomConfigurationFileTree(const char* dir, cmMakefile* mf)
{
  bool found = false;
  VectorOfStrings dirs;
  VectorOfStrings ndirs;
  cmCTestLog(this, DEBUG, "* Read custom CTest configuration directory: "
    << dir << std::endl);

  std::string fname = dir;
  fname += "/CTestCustom.cmake";
  cmCTestLog(this, DEBUG, "* Check for file: "
    << fname << std::endl);
  if ( cmSystemTools::FileExists(fname.c_str()) )
    {
    cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
      << fname << std::endl);
    bool erroroc = cmSystemTools::GetErrorOccuredFlag();
    cmSystemTools::ResetErrorOccuredFlag();

    if ( !mf->ReadListFile(fname.c_str()) ||
      cmSystemTools::GetErrorOccuredFlag() )
      {
      cmCTestLog(this, ERROR_MESSAGE,
        "Problem reading custom configuration: "
        << fname << std::endl);
      }
    found = true;
    if ( erroroc )
      {
      cmSystemTools::SetErrorOccured();
      }
    }

  std::string rexpr = dir;
  rexpr += "/CTestCustom.ctest";
  cmCTestLog(this, DEBUG, "* Check for file: "
    << rexpr << std::endl);
  if ( !found && cmSystemTools::FileExists(rexpr.c_str()) )
    {
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.FindFiles(rexpr);
    std::vector<std::string>& files = gl.GetFiles();
    std::vector<std::string>::iterator fileIt;
    for ( fileIt = files.begin(); fileIt != files.end();
      ++ fileIt )
      {
      cmCTestLog(this, DEBUG, "* Read custom CTest configuration file: "
        << *fileIt << std::endl);
      if ( !mf->ReadListFile(fileIt->c_str()) ||
        cmSystemTools::GetErrorOccuredFlag() )
        {
        cmCTestLog(this, ERROR_MESSAGE,
          "Problem reading custom configuration: "
          << *fileIt << std::endl);
        }
      }
    found = true;
    }

  if ( found )
    {
    cmCTest::t_TestingHandlers::iterator it;
    for ( it = this->TestingHandlers.begin();
      it != this->TestingHandlers.end(); ++ it )
      {
      cmCTestLog(this, DEBUG,
        "* Read custom CTest configuration vectors for handler: "
        << it->first << " (" << it->second << ")" << std::endl);
      it->second->PopulateCustomVectors(mf);
      }
    }

  return 1;
}